

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDecompress.c
# Opt level: O2

USTATUS LzmaDecompress(void *Source,UINT32 SourceSize,void *Destination)

{
  SRes SVar1;
  ELzmaStatus Status;
  SizeT EncodedDataSize;
  SizeT DecodedBufSize;
  
  DecodedBufSize = GetDecodedSizeOfBuf((UINT8 *)Source);
  EncodedDataSize = (SizeT)(SourceSize - 0xd);
  SVar1 = LzmaDecode((Byte *)Destination,&DecodedBufSize,(Byte *)((long)Source + 0xd),
                     &EncodedDataSize,(Byte *)Source,5,LZMA_FINISH_END,&Status,&SzAllocForLzma);
  return (ulong)(SVar1 != 0);
}

Assistant:

USTATUS
EFIAPI
LzmaDecompress (
    CONST VOID  *Source,
    UINT32      SourceSize,
    VOID        *Destination
    )
{
    SRes              LzmaResult;
    ELzmaStatus       Status;
    SizeT             DecodedBufSize;
    SizeT             EncodedDataSize;

    DecodedBufSize = (SizeT)GetDecodedSizeOfBuf((UINT8*)Source);
    EncodedDataSize = (SizeT)(SourceSize - LZMA_HEADER_SIZE);

    LzmaResult = LzmaDecode(
        (Byte*)Destination,
        &DecodedBufSize,
        (Byte*)((UINT8*)Source + LZMA_HEADER_SIZE),
        &EncodedDataSize,
        (CONST Byte*) Source,
        LZMA_PROPS_SIZE,
        LZMA_FINISH_END,
        &Status,
        &SzAllocForLzma
        );

    if (LzmaResult == SZ_OK) {
        return U_SUCCESS;
    }
    else {
        return U_INVALID_PARAMETER;
    }
}